

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  undefined1 *puVar1;
  urlpieces *puVar2;
  byte bVar3;
  undefined4 uVar4;
  char cVar5;
  _Bool _Var6;
  ushort uVar7;
  ConnectBits CVar8;
  CURLUcode CVar9;
  CURLUcode CVar10;
  CURLUcode CVar11;
  CURLUcode CVar12;
  int iVar13;
  size_t sVar14;
  size_t sVar15;
  connectdata *conn;
  char *pcVar16;
  CURLU *u;
  size_t sVar17;
  stsentry *psVar18;
  char *pcVar19;
  Curl_handler *pCVar20;
  long lVar21;
  ulong ulnum;
  connectbundle *bundle;
  connectdata *pcVar22;
  uint uVar23;
  uint uVar24;
  char *pcVar25;
  char *pcVar26;
  curl_proxytype proxytype;
  char **ppcVar27;
  bool bVar28;
  curltime cVar29;
  _Bool waitpipe;
  _Bool force_reuse;
  connectdata *existing;
  char *newurl;
  _Bool local_f3;
  _Bool local_f2;
  _Bool local_f1;
  _Bool *local_f0;
  _Bool *local_e8;
  CURLUcode local_dc;
  urlpieces *local_d8;
  size_t local_d0;
  size_t local_c8;
  connectdata *local_c0;
  char *local_b8 [17];
  
  *asyncp = false;
  Curl_free_request_state(data);
  memset(&data->req,0,0xc0);
  *(undefined4 *)&(data->req).size = 0xffffffff;
  *(undefined4 *)((long)&(data->req).size + 4) = 0xffffffff;
  *(undefined4 *)&(data->req).maxdownload = 0xffffffff;
  *(undefined4 *)((long)&(data->req).maxdownload + 4) = 0xffffffff;
  *(ushort *)&(data->req).field_0xbb =
       *(ushort *)&(data->req).field_0xbb & 0xefff |
       (ushort)(*(uint *)&(data->set).field_0x8ba >> 0xf) & 0x1000;
  local_c0 = (connectdata *)0x0;
  local_f1 = false;
  local_f3 = false;
  sVar14 = Curl_multi_max_host_connections(data->multi);
  sVar15 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  if ((data->state).url == (char *)0x0) {
    CVar9 = CURLUE_MALFORMED_INPUT;
    conn = (connectdata *)0x0;
    goto LAB_005c7c85;
  }
  local_d0 = sVar14;
  conn = (connectdata *)(*Curl_ccalloc)(1,0x488);
  uVar23 = 0;
  if (conn == (connectdata *)0x0) {
LAB_005c7635:
    conn = (connectdata *)0x0;
  }
  else {
    conn->sock[0] = -1;
    conn->sock[1] = -1;
    conn->sockfd = -1;
    conn->writesockfd = -1;
    conn->connection_id = -1;
    conn->port = -1;
    conn->remote_port = -1;
    Curl_conncontrol(conn,1);
    cVar29 = Curl_now();
    (conn->created).tv_sec = cVar29.tv_sec;
    (conn->created).tv_usec = cVar29.tv_usec;
    (conn->keepalive).tv_sec = (conn->created).tv_sec;
    (conn->keepalive).tv_usec = (conn->created).tv_usec;
    *(undefined4 *)&(conn->keepalive).field_0xc = *(undefined4 *)&(conn->created).field_0xc;
    bVar3 = (data->set).proxytype;
    (conn->http_proxy).proxytype = bVar3;
    (conn->socks_proxy).proxytype = '\x04';
    pcVar16 = (data->set).str[0x15];
    if (pcVar16 != (char *)0x0) {
      uVar23 = (uint)(*pcVar16 != '\0') << 5;
    }
    CVar8 = conn->bits;
    uVar24 = (uint)(bVar3 < 4 && uVar23 != 0);
    conn->bits = (ConnectBits)
                 ((uVar24 | (uint)CVar8 & 0xffffffdc) + (uint)(bVar3 >= 4 && uVar23 != 0) * 2 |
                 uVar23);
    pcVar16 = (data->set).str[0x16];
    if ((pcVar16 != (char *)0x0) && (*pcVar16 != '\0')) {
      conn->bits = (ConnectBits)(uVar24 | (uint)CVar8 & 0xffffffde | 0x22);
    }
    CVar8 = (ConnectBits)
            (((uint)conn->bits & 0xfffffffb) +
            (uint)((data->state).aptr.proxyuser != (char *)0x0) * 4);
    conn->bits = CVar8;
    uVar23 = *(uint *)&(data->set).field_0x8ba >> 5 & 8;
    conn->bits = (ConnectBits)((uint)CVar8 & 0xfffffff7 | uVar23);
    uVar24 = (*(uint *)&(data->set).field_0x8ba & 0x2000) << 4;
    conn->bits = (ConnectBits)((uint)CVar8 & 0xfffdfff7 | uVar23 | uVar24);
    conn->bits = (ConnectBits)
                 ((uint)CVar8 & 0xfff9fff7 | uVar23 | uVar24 |
                 (*(uint *)&(data->set).field_0x8ba & 0x4000) << 4);
    conn->ip_version = (data->set).ipver;
    conn->connect_only = (data->set).connect_only;
    conn->transport = '\x03';
    Curl_llist_init(&conn->easyq,(Curl_llist_dtor)0x0);
    pcVar16 = (data->set).str[8];
    if (pcVar16 != (char *)0x0) {
      pcVar16 = (*Curl_cstrdup)(pcVar16);
      conn->localdev = pcVar16;
      if (pcVar16 == (char *)0x0) {
        (*Curl_cfree)((void *)0x0);
        (*Curl_cfree)(conn);
        goto LAB_005c7635;
      }
    }
    conn->localportrange = (data->set).localportrange;
    conn->localport = (data->set).localport;
    conn->fclosesocket = (data->set).fclosesocket;
    conn->closesocket_client = (data->set).closesocket_client;
    iVar13 = (conn->created).tv_usec;
    uVar4 = *(undefined4 *)&(conn->created).field_0xc;
    (conn->lastused).tv_sec = (conn->created).tv_sec;
    (conn->lastused).tv_usec = iVar13;
    *(undefined4 *)&(conn->lastused).field_0xc = uVar4;
    conn->gssapi_delegation = (data->set).gssapi_delegation;
  }
  if (conn == (connectdata *)0x0) {
    CVar9 = CURLUE_BAD_SCHEME;
    conn = (connectdata *)0x0;
    goto LAB_005c7c85;
  }
  if ((data->set).uh == (CURLU *)0x0) {
    bVar28 = false;
  }
  else {
    bVar28 = ((data->state).field_0x74c & 2) == 0;
  }
  local_f0 = protocol_done;
  local_e8 = asyncp;
  up_free(data);
  local_c8 = sVar15;
  if (bVar28) {
    u = curl_url_dup((data->set).uh);
  }
  else {
    u = curl_url();
  }
  (data->state).uh = u;
  CVar9 = CURLUE_BAD_SCHEME;
  if (u == (CURLU *)0x0) goto switchD_005c7c1a_caseD_1;
  if (((data->set).str[7] != (char *)0x0) &&
     (sVar14 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar14 == 0)) {
    pcVar16 = curl_maprintf("%s://%s",(data->set).str[7],(data->state).url);
    if (pcVar16 == (char *)0x0) goto switchD_005c7c1a_caseD_1;
    if (((data->state).field_0x74e & 1) != 0) {
      (*Curl_cfree)((data->state).url);
    }
    (data->state).url = pcVar16;
    puVar1 = &(data->state).field_0x74e;
    *puVar1 = *puVar1 | 1;
  }
  CVar12 = CURLUE_BAD_SCHEME;
  if (bVar28) goto LAB_005c782e;
  uVar23 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x8ba >> 0x20);
  CVar9 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                       (uVar23 >> 0xb & 0x20) + (uVar23 >> 6 & 0x10) + 0x208);
  if (CVar9 != CURLUE_OK) {
    pcVar16 = curl_url_strerror(CVar9);
    bVar28 = false;
    Curl_failf(data,"URL rejected: %s",pcVar16);
    if (CVar9 == CURLUE_USER_NOT_ALLOWED) {
switchD_005c77d0_caseD_8:
      CVar12 = 0x43;
      goto LAB_005c781f;
    }
    if (CVar9 == CURLUE_OUT_OF_MEMORY) goto switchD_005c77d0_caseD_7;
    CVar12 = CURLUE_MALFORMED_INPUT;
    if (CVar9 == CURLUE_UNSUPPORTED_SCHEME) goto switchD_005c77d0_caseD_5;
    goto switchD_005c77d0_caseD_1;
  }
  bVar28 = false;
  CVar9 = curl_url_get(u,CURLUPART_URL,local_b8,0);
  CVar12 = CURLUE_MALFORMED_INPUT;
  switch(CVar9) {
  case CURLUE_OK:
    if (((data->state).field_0x74e & 1) != 0) {
      (*Curl_cfree)((data->state).url);
    }
    (data->state).url = local_b8[0];
    puVar1 = &(data->state).field_0x74e;
    *puVar1 = *puVar1 | 1;
    CVar12 = CURLUE_BAD_SCHEME;
    bVar28 = true;
    break;
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_005c77d0_caseD_5:
    CVar12 = CURLUE_BAD_HANDLE;
    goto LAB_005c781f;
  case CURLUE_OUT_OF_MEMORY:
switchD_005c77d0_caseD_7:
    CVar12 = CURLUE_BAD_SCHEME;
LAB_005c781f:
    bVar28 = false;
    break;
  case CURLUE_USER_NOT_ALLOWED:
    goto switchD_005c77d0_caseD_8;
  }
switchD_005c77d0_caseD_1:
  CVar9 = CVar12;
  if (!bVar28) goto switchD_005c7c1a_caseD_1;
LAB_005c782e:
  puVar2 = &(data->state).up;
  CVar9 = curl_url_get(u,CURLUPART_SCHEME,&puVar2->scheme,0);
  switch(CVar9) {
  case CURLUE_OK:
    ppcVar27 = &(data->state).up.hostname;
    CVar9 = curl_url_get(u,CURLUPART_HOST,ppcVar27,0);
    if (CVar9 == CURLUE_OK) {
      sVar17 = strlen(*ppcVar27);
      if (sVar17 < 0x10000) goto LAB_005c78c4;
      Curl_failf(data,"Too long host name (maximum is %d)",0xffff);
      goto switchD_005c785c_caseD_1;
    }
    iVar13 = curl_strequal("file",puVar2->scheme);
    if (iVar13 == 0) goto switchD_005c785c_caseD_7;
LAB_005c78c4:
    pcVar16 = *ppcVar27;
    local_d8 = puVar2;
    if (pcVar16 == (char *)0x0) {
      pcVar26 = (char *)0x0;
    }
    else {
      pcVar26 = pcVar16;
      if (*pcVar16 == '[') {
        puVar1 = &(conn->bits).field_0x1;
        *puVar1 = *puVar1 | 8;
        pcVar26 = pcVar16 + 1;
        sVar17 = strlen(pcVar26);
        pcVar16[sVar17] = '\0';
        zonefrom_url(u,data,conn);
      }
    }
    pcVar16 = "";
    if (pcVar26 != (char *)0x0) {
      pcVar16 = pcVar26;
    }
    pcVar16 = (*Curl_cstrdup)(pcVar16);
    (conn->host).rawalloc = pcVar16;
    if (pcVar16 == (char *)0x0) goto switchD_005c785c_caseD_7;
    (conn->host).name = pcVar16;
    CVar9 = Curl_idnconvert_hostname(&conn->host);
    puVar2 = local_d8;
    if (CVar9 != CURLUE_OK) break;
    if (((data->hsts != (hsts *)0x0) &&
        (iVar13 = curl_strequal("http",local_d8->scheme), iVar13 != 0)) &&
       (psVar18 = Curl_hsts(data->hsts,(conn->host).name,true), psVar18 != (stsentry *)0x0)) {
      (*Curl_cfree)(puVar2->scheme);
      puVar2->scheme = (char *)0x0;
      CVar10 = curl_url_set(u,CURLUPART_SCHEME,"https",0);
      CVar9 = CURLUE_MALFORMED_INPUT;
      switch(CVar10) {
      case CURLUE_OK:
        if (((data->state).field_0x74e & 1) != 0) {
          (*Curl_cfree)((data->state).url);
          (data->state).url = (char *)0x0;
        }
        CVar10 = curl_url_get(u,CURLUPART_URL,local_b8,0);
        switch(CVar10) {
        case CURLUE_OK:
          local_dc = curl_url_get(u,CURLUPART_SCHEME,&local_d8->scheme,0);
          if (local_dc != CURLUE_OK) {
            (*Curl_cfree)(local_b8[0]);
            if (local_dc == CURLUE_USER_NOT_ALLOWED) goto switchD_005c79da_caseD_8;
            if (local_dc == CURLUE_OUT_OF_MEMORY) goto switchD_005c79da_caseD_7;
            if (local_dc == CURLUE_UNSUPPORTED_SCHEME) goto switchD_005c79da_caseD_5;
            goto switchD_005c79da_caseD_1;
          }
          (data->state).url = local_b8[0];
          puVar1 = &(data->state).field_0x74e;
          *puVar1 = *puVar1 | 1;
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"Switched from HTTP to HTTPS due to HSTS => %s");
          }
          bVar28 = true;
          break;
        default:
          goto switchD_005c79da_caseD_1;
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_005c79da_caseD_5;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_005c79da_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_005c79da_caseD_8;
        }
        goto LAB_005c7a74;
      case CURLUE_UNSUPPORTED_SCHEME:
switchD_005c79da_caseD_5:
        CVar9 = CURLUE_BAD_HANDLE;
        break;
      case CURLUE_OUT_OF_MEMORY:
switchD_005c79da_caseD_7:
        CVar9 = CURLUE_BAD_SCHEME;
        break;
      case CURLUE_USER_NOT_ALLOWED:
switchD_005c79da_caseD_8:
        CVar9 = 0x43;
      }
switchD_005c79da_caseD_1:
      CVar12 = CVar9;
      bVar28 = false;
LAB_005c7a74:
      CVar9 = CVar12;
      if (!bVar28) break;
    }
    CVar9 = findprotocol(data,conn,(data->state).up.scheme);
    if (CVar9 != CURLUE_OK) break;
    CVar10 = CURLUE_OK;
    if ((data->set).str[0x2b] == (char *)0x0) {
      ppcVar27 = &(data->state).up.password;
      CVar11 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar27,0);
      CVar10 = CURLUE_OK;
      CVar9 = CURLUE_MALFORMED_INPUT;
      switch(CVar11) {
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_005c785c_caseD_5;
      case CURLUE_URLDECODE:
      case CURLUE_UNKNOWN_PART:
      case CURLUE_NO_SCHEME:
      case CURLUE_NO_USER:
        break;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_005c785c_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_005c785c_caseD_8;
      case CURLUE_NO_PASSWORD:
        goto switchD_005c7b26_caseD_c;
      default:
        if (CVar11 == CURLUE_OK) {
          bVar28 = false;
          CVar10 = Curl_urldecode(*ppcVar27,0,local_b8,(size_t *)0x0,
                                  ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
          CVar9 = CVar10;
          if (CVar10 == CURLUE_OK) {
            conn->passwd = local_b8[0];
            CVar10 = Curl_setstropt(&(data->state).aptr.passwd,local_b8[0]);
            bVar28 = CVar10 == CURLUE_OK;
            CVar9 = CVar12;
            if (!bVar28) {
              CVar9 = CVar10;
            }
          }
          CVar12 = CVar9;
          if (bVar28) goto switchD_005c7b26_caseD_c;
        }
      }
      break;
    }
switchD_005c7b26_caseD_c:
    if ((data->set).str[0x2a] == (char *)0x0) {
      ppcVar27 = &(data->state).up.user;
      CVar9 = curl_url_get(u,CURLUPART_USER,ppcVar27,0);
      switch(CVar9) {
      case CURLUE_OK:
        CVar10 = Curl_urldecode(*ppcVar27,0,local_b8,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        CVar9 = CVar10;
        local_dc = CVar10;
        if (CVar10 == CURLUE_OK) {
          conn->user = local_b8[0];
          CVar10 = Curl_setstropt(&(data->state).aptr.user,local_b8[0]);
          CVar9 = CVar12;
        }
        if (local_dc != CURLUE_OK) goto switchD_005c7c1a_caseD_1;
        break;
      default:
        goto switchD_005c785c_caseD_1;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_005c785c_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_005c785c_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_005c785c_caseD_8;
      case CURLUE_NO_USER:
        if ((data->state).aptr.passwd != (char *)0x0) {
          CVar10 = Curl_setstropt(&(data->state).aptr.user,"");
        }
      }
      CVar9 = CVar10;
      if (CVar10 != CURLUE_OK) break;
    }
    ppcVar27 = &(data->state).up.options;
    CVar9 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar27,0x40);
    switch(CVar9) {
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_005c785c_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
switchD_005c785c_caseD_7:
      CVar9 = CURLUE_BAD_SCHEME;
      break;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_005c785c_caseD_8;
    case CURLUE_NO_OPTIONS:
switchD_005c7ae9_caseD_d:
      CVar12 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
      CVar9 = CURLUE_MALFORMED_INPUT;
      switch(CVar12) {
      case CURLUE_OK:
        CVar9 = curl_url_get(u,CURLUPART_PORT,&(data->state).up.port,1);
        if (CVar9 == CURLUE_OK) {
          ulnum = strtoul((data->state).up.port,(char **)0x0,10);
          uVar7 = (data->set).use_port;
          if ((uVar7 == 0) || (((data->state).field_0x74c & 0x10) == 0)) {
            uVar7 = curlx_ultous(ulnum);
          }
          conn->remote_port = (uint)uVar7;
          conn->port = (uint)uVar7;
        }
        else {
          iVar13 = curl_strequal("file",local_d8->scheme);
          CVar9 = CURLUE_BAD_SCHEME;
          if (iVar13 == 0) break;
        }
        curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
        uVar23 = (data->set).scope_id;
        CVar9 = CURLUE_OK;
        if (uVar23 != 0) {
          conn->scope_id = uVar23;
        }
        break;
      case CURLUE_BAD_HANDLE:
      case CURLUE_BAD_PARTPOINTER:
      case CURLUE_MALFORMED_INPUT:
      case CURLUE_BAD_PORT_NUMBER:
      case CURLUE_URLDECODE:
        break;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_005c785c_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_005c785c_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_005c785c_caseD_8;
      default:
        goto switchD_005c785c_caseD_1;
      }
      break;
    default:
      if (CVar9 == CURLUE_OK) {
        pcVar16 = (*Curl_cstrdup)(*ppcVar27);
        conn->options = pcVar16;
        if (pcVar16 != (char *)0x0) goto switchD_005c7ae9_caseD_d;
        goto switchD_005c785c_caseD_7;
      }
    case CURLUE_URLDECODE:
    case CURLUE_UNKNOWN_PART:
    case CURLUE_NO_SCHEME:
    case CURLUE_NO_USER:
    case CURLUE_NO_PASSWORD:
switchD_005c785c_caseD_1:
      CVar9 = CURLUE_MALFORMED_INPUT;
    }
    break;
  default:
    goto switchD_005c785c_caseD_1;
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_005c785c_caseD_5:
    CVar9 = CURLUE_BAD_HANDLE;
    break;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_005c785c_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_005c785c_caseD_8:
    CVar9 = 0x43;
  }
switchD_005c7c1a_caseD_1:
  asyncp = local_e8;
  protocol_done = local_f0;
  if (CVar9 != CURLUE_OK) goto LAB_005c7c85;
  pcVar16 = (data->set).str[0x46];
  if (pcVar16 != (char *)0x0) {
    pcVar16 = (*Curl_cstrdup)(pcVar16);
    conn->sasl_authzid = pcVar16;
    if (pcVar16 != (char *)0x0) goto LAB_005c7d2c;
LAB_005c7dfe:
    CVar9 = CURLUE_BAD_SCHEME;
    goto LAB_005c7c85;
  }
LAB_005c7d2c:
  pcVar16 = (data->set).str[0x40];
  if (pcVar16 != (char *)0x0) {
    pcVar16 = (*Curl_cstrdup)(pcVar16);
    conn->oauth_bearer = pcVar16;
    if (pcVar16 == (char *)0x0) goto LAB_005c7dfe;
  }
  local_f2 = false;
  if (((uint)conn->bits & 4) == 0) {
LAB_005c7e08:
    pcVar16 = (data->set).str[0x15];
    if (pcVar16 == (char *)0x0) {
      pcVar16 = (char *)0x0;
    }
    else {
      pcVar16 = (*Curl_cstrdup)(pcVar16);
      if (pcVar16 == (char *)0x0) {
        Curl_failf(data,"memory shortage");
        CVar9 = CURLUE_BAD_SCHEME;
        goto LAB_005c7e3e;
      }
    }
    pcVar26 = (data->set).str[0x16];
    if (pcVar26 == (char *)0x0) {
      pcVar26 = (char *)0x0;
    }
    else {
      pcVar26 = (*Curl_cstrdup)(pcVar26);
      if (pcVar26 == (char *)0x0) {
        pcVar26 = (char *)0x0;
        Curl_failf(data,"memory shortage");
        CVar9 = CURLUE_BAD_SCHEME;
        goto LAB_005c8292;
      }
    }
    if ((data->set).str[0x2f] == (char *)0x0) {
      pcVar25 = "no_proxy";
      pcVar19 = curl_getenv("no_proxy");
      if (pcVar19 == (char *)0x0) {
        pcVar25 = "NO_PROXY";
        pcVar19 = curl_getenv("NO_PROXY");
      }
      if ((data != (Curl_easy *)0x0 && pcVar19 != (char *)0x0) &&
         (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar25,pcVar19);
      }
    }
    else {
      pcVar19 = (char *)0x0;
    }
    pcVar25 = (data->set).str[0x2f];
    if (pcVar25 == (char *)0x0) {
      pcVar25 = pcVar19;
    }
    _Var6 = Curl_check_noproxy((conn->host).name,pcVar25,&local_f2);
    if (_Var6) {
      (*Curl_cfree)(pcVar16);
      (*Curl_cfree)(pcVar26);
      pcVar16 = (char *)0x0;
LAB_005c7f2c:
      pcVar26 = (char *)0x0;
    }
    else if (pcVar16 == (char *)0x0 && pcVar26 == (char *)0x0) {
      pcVar16 = conn->handler->scheme;
      cVar5 = *pcVar16;
      if (cVar5 == '\0') {
        ppcVar27 = local_b8;
      }
      else {
        ppcVar27 = local_b8;
        do {
          pcVar16 = pcVar16 + 1;
          cVar5 = Curl_raw_tolower(cVar5);
          *(char *)ppcVar27 = cVar5;
          ppcVar27 = (char **)((long)ppcVar27 + 1);
          cVar5 = *pcVar16;
        } while (cVar5 != '\0');
      }
      builtin_strncpy((char *)((long)ppcVar27 + 3),"oxy",4);
      *(undefined4 *)ppcVar27 = 0x6f72705f;
      pcVar26 = (char *)local_b8;
      pcVar16 = curl_getenv(pcVar26);
      if (pcVar16 == (char *)0x0) {
        iVar13 = curl_strequal("http_proxy",(char *)local_b8);
        if (iVar13 == 0) {
          Curl_strntoupper((char *)local_b8,(char *)local_b8,0x80);
          pcVar16 = curl_getenv((char *)local_b8);
        }
        else {
          pcVar16 = (char *)0x0;
        }
      }
      if (pcVar16 == (char *)0x0) {
        pcVar26 = "all_proxy";
        pcVar16 = curl_getenv("all_proxy");
        if (pcVar16 == (char *)0x0) {
          pcVar26 = "ALL_PROXY";
          pcVar16 = curl_getenv("ALL_PROXY");
        }
      }
      if (((data != (Curl_easy *)0x0) && (pcVar16 != (char *)0x0)) &&
         (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar26,pcVar16);
      }
      goto LAB_005c7f2c;
    }
    if (((data != (Curl_easy *)0x0) && (local_f2 != false)) &&
       (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"space-separated NOPROXY patterns are deprecated");
    }
    (*Curl_cfree)(pcVar19);
    if (pcVar16 == (char *)0x0) {
LAB_005c7f97:
      pcVar16 = (char *)0x0;
    }
    else if ((*pcVar16 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
      (*Curl_cfree)(pcVar16);
      goto LAB_005c7f97;
    }
    if (pcVar26 == (char *)0x0) {
LAB_005c7fc3:
      pcVar26 = (char *)0x0;
    }
    else if ((*pcVar26 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
      (*Curl_cfree)(pcVar26);
      goto LAB_005c7fc3;
    }
    if (pcVar16 == (char *)0x0 && pcVar26 == (char *)0x0) {
      *(byte *)&conn->bits = *(byte *)&conn->bits & 0xfc;
      pcVar26 = (char *)0x0;
      CVar9 = CURLUE_OK;
LAB_005c824e:
      CVar8 = conn->bits;
      uVar23 = 0x20;
      if (((uint)CVar8 & 1) == 0) {
        uVar23 = ((uint)CVar8 & 2) << 4;
      }
      conn->bits = (ConnectBits)((uint)CVar8 & 0xffffffdf | uVar23);
      if (uVar23 == 0) {
        conn->bits = (ConnectBits)((uint)CVar8 & 0xffffffd0);
        (conn->http_proxy).proxytype = '\0';
      }
    }
    else {
      proxytype = (curl_proxytype)(conn->http_proxy).proxytype;
      if (pcVar16 == (char *)0x0) {
LAB_005c7fff:
        if (pcVar26 != (char *)0x0) {
          CVar9 = parse_proxy(data,conn,pcVar26,proxytype);
          (*Curl_cfree)(pcVar26);
          if (CVar9 != CURLUE_OK) {
            pcVar26 = (char *)0x0;
            goto LAB_005c802a;
          }
        }
        pcVar16 = (conn->http_proxy).host.rawalloc;
        if (pcVar16 == (char *)0x0) {
          CVar8 = (ConnectBits)((uint)conn->bits & 0xfffffff6);
        }
        else {
          if ((conn->handler->protocol & 3) == 0) {
            if (((conn->handler->flags & 0x800) == 0) || (((uint)conn->bits & 8) != 0)) {
              *(byte *)&conn->bits = *(byte *)&conn->bits | 8;
            }
            else {
              conn->handler = &Curl_handler_http;
            }
          }
          CVar8 = (ConnectBits)((uint)conn->bits | 1);
        }
        conn->bits = CVar8;
        if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
          CVar8 = (ConnectBits)((uint)CVar8 & 0xfffffffd);
        }
        else {
          if ((pcVar16 == (char *)0x0) && ((conn->socks_proxy).user == (char *)0x0)) {
            pcVar16 = (conn->socks_proxy).passwd;
            (conn->socks_proxy).user = (conn->http_proxy).user;
            (conn->http_proxy).user = (char *)0x0;
            (*Curl_cfree)(pcVar16);
            (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
            (conn->http_proxy).passwd = (char *)0x0;
          }
          CVar8 = (ConnectBits)((uint)conn->bits | 2);
        }
        conn->bits = CVar8;
        bVar28 = true;
        pcVar26 = (char *)0x0;
        CVar9 = CURLUE_OK;
      }
      else {
        CVar9 = parse_proxy(data,conn,pcVar16,proxytype);
        (*Curl_cfree)(pcVar16);
        if (CVar9 == CURLUE_OK) goto LAB_005c7fff;
LAB_005c802a:
        bVar28 = false;
      }
      if (bVar28) goto LAB_005c824e;
    }
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (data->state).aptr.proxyuser;
    pcVar26 = (data->state).aptr.proxypasswd;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = "";
    }
    if (pcVar26 == (char *)0x0) {
      pcVar26 = "";
    }
    ppcVar27 = &(conn->http_proxy).user;
    CVar9 = Curl_urldecode(pcVar16,0,ppcVar27,(size_t *)0x0,REJECT_ZERO);
    if (CVar9 == CURLUE_OK) {
      CVar9 = Curl_setstropt(&(data->state).aptr.proxyuser,*ppcVar27);
    }
    if (CVar9 == CURLUE_OK) {
      CVar9 = Curl_urldecode(pcVar26,0,&(conn->http_proxy).passwd,(size_t *)0x0,REJECT_ZERO);
    }
    if (CVar9 == CURLUE_OK) {
      CVar9 = Curl_setstropt(&(data->state).aptr.proxypasswd,(conn->http_proxy).passwd);
    }
    if (CVar9 == CURLUE_OK) goto LAB_005c7e08;
LAB_005c7e3e:
    pcVar16 = (char *)0x0;
    pcVar26 = (char *)0x0;
  }
LAB_005c8292:
  (*Curl_cfree)(pcVar26);
  (*Curl_cfree)(pcVar16);
  asyncp = local_e8;
  protocol_done = local_f0;
  if (CVar9 != CURLUE_OK) goto LAB_005c7c85;
  if (((conn->given->flags & 1) != 0) && (((uint)conn->bits & 1) != 0)) {
    conn->bits = (ConnectBits)((uint)conn->bits | 8);
  }
  uVar7 = (data->set).use_port;
  if ((uVar7 == 0) || (((data->state).field_0x74c & 0x10) == 0)) {
LAB_005c8333:
    CVar9 = CURLUE_OK;
    bVar28 = true;
  }
  else {
    conn->remote_port = (uint)uVar7;
    bVar28 = false;
    curl_msnprintf((char *)local_b8,0x10,"%d");
    CVar12 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_b8,0);
    CVar9 = CURLUE_BAD_SCHEME;
    if (CVar12 == CURLUE_OK) goto LAB_005c8333;
  }
  protocol_done = local_f0;
  if ((((((!bVar28) ||
         (CVar9 = override_login(data,conn), protocol_done = local_f0, CVar9 != CURLUE_OK)) ||
        (CVar9 = set_login(data,conn), CVar9 != CURLUE_OK)) ||
       (CVar9 = parse_connect_to_slist(data,conn,(data->set).connect_to), CVar9 != CURLUE_OK)) ||
      ((((uint)conn->bits & 1) != 0 &&
       (CVar9 = Curl_idnconvert_hostname(&(conn->http_proxy).host), CVar9 != CURLUE_OK)))) ||
     (((((uint)conn->bits & 2) != 0 &&
       (CVar9 = Curl_idnconvert_hostname(&(conn->socks_proxy).host), CVar9 != CURLUE_OK)) ||
      ((((conn->bits).field_0x1 & 2) != 0 &&
       (CVar9 = Curl_idnconvert_hostname(&conn->conn_to_host), CVar9 != CURLUE_OK))))))
  goto LAB_005c7c85;
  if ((((conn->bits).field_0x1 & 2) != 0) &&
     (iVar13 = curl_strequal((conn->conn_to_host).name,(conn->host).name), iVar13 != 0)) {
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 & 0xfd;
  }
  if ((((uint)conn->bits >> 10 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
    conn->bits = (ConnectBits)((uint)conn->bits & 0xfffffbff);
  }
  CVar8 = conn->bits;
  if (((uint)CVar8 & 1) != 0 && ((uint)CVar8 & 0x600) != 0) {
    conn->bits = (ConnectBits)((uint)CVar8 | 8);
  }
  pCVar20 = conn->handler;
  if (pCVar20->setup_connection == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0) {
LAB_005c847a:
    CVar9 = CURLUE_OK;
    if (conn->port < 0) {
      conn->port = pCVar20->defport;
    }
  }
  else {
    CVar9 = (*pCVar20->setup_connection)(data,conn);
    if (CVar9 == CURLUE_OK) {
      pCVar20 = conn->handler;
      goto LAB_005c847a;
    }
  }
  if (CVar9 != CURLUE_OK) goto LAB_005c7c85;
  if ((conn->handler->flags & 0x10) != 0) {
    Curl_persistconninfo(data,conn,(char *)0x0,-1);
    CVar9 = (*conn->handler->connect_it)(data,(_Bool *)local_b8);
    if (CVar9 == CURLUE_OK) {
      Curl_attach_connection(data,conn);
      CVar9 = Curl_conncache_add_conn(data);
      asyncp = local_e8;
      protocol_done = local_f0;
      if (CVar9 != CURLUE_OK) goto LAB_005c7c85;
      CVar9 = setup_range(data);
      if (CVar9 != CURLUE_OK) {
        (*conn->handler->done)(data,CVar9,false);
        asyncp = local_e8;
        protocol_done = local_f0;
        goto LAB_005c7c85;
      }
      CVar9 = CURLUE_OK;
      Curl_setup_transfer(data,-1,-1,false,-1);
    }
    Curl_init_do(data,conn);
    asyncp = local_e8;
    protocol_done = local_f0;
    goto LAB_005c7c85;
  }
  conn->recv[0] = Curl_conn_recv;
  conn->send[0] = Curl_conn_send;
  conn->recv[1] = Curl_conn_recv;
  conn->send[1] = Curl_conn_send;
  conn->bits = (ConnectBits)
               ((uint)conn->bits & 0xfeffffff | *(uint *)&(data->set).field_0x8bc & 0x1000000);
  CVar9 = Curl_ssl_easy_config_complete(data);
  asyncp = local_e8;
  protocol_done = local_f0;
  if (CVar9 != CURLUE_OK) goto LAB_005c7c85;
  prune_dead_connections(data);
  if ((((((data->set).field_0x8bd & 0x80) == 0) || ((data->state).followlocation != 0)) &&
      ((data->set).connect_only == '\0')) &&
     (_Var6 = ConnectionExists(data,conn,&local_c0,&local_f1,&local_f3), pcVar22 = local_c0, _Var6))
  {
    reuse_conn(data,conn,local_c0);
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      pcVar16 = "proxy";
      if (((uint)pcVar22->bits & 0x20) == 0) {
        pcVar16 = "host";
      }
      lVar21 = 0xa8;
      if (((pcVar22->socks_proxy).host.name == (char *)0x0) &&
         (lVar21 = 0xe0, (pcVar22->http_proxy).host.name == (char *)0x0)) {
        lVar21 = 0x58;
      }
      Curl_infof(data,"Re-using existing connection with %s %s",pcVar16,
                 *(undefined8 *)((long)&(pcVar22->bundle_node).ptr + lVar21));
    }
  }
  else {
    if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x8bf & 2) != 0)) {
      puVar1 = &(conn->bits).field_0x3;
      *puVar1 = *puVar1 | 2;
    }
    if (local_f3 == false) {
      bundle = Curl_conncache_find_bundle(data,conn,(data->state).conn_cache);
      if ((bundle == (connectbundle *)0x0 || local_d0 == 0) || (bundle->num_connections < local_d0))
      {
        bVar28 = true;
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
        }
      }
      else {
        pcVar22 = Curl_conncache_extract_bundle(data,bundle);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
        }
        if (pcVar22 == (connectdata *)0x0) {
          if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8bd & 0x10) == 0))
          goto LAB_005c87d9;
          bVar28 = false;
          Curl_infof(data,"No more connections allowed to host: %zu",local_d0);
        }
        else {
          Curl_disconnect(data,pcVar22,false);
          bVar28 = true;
        }
      }
    }
    else {
LAB_005c87d9:
      bVar28 = false;
    }
    if (((bool)(local_c8 != 0 & bVar28)) && (sVar14 = Curl_conncache_size(data), local_c8 <= sVar14)
       ) {
      pcVar22 = Curl_conncache_extract_oldest(data);
      if (pcVar22 == (connectdata *)0x0) {
        if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8bd & 0x10) == 0)) {
          bVar28 = false;
        }
        else {
          bVar28 = false;
          Curl_infof(data,"No connections available in cache");
        }
      }
      else {
        Curl_disconnect(data,pcVar22,false);
      }
    }
    if (!bVar28) {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"No connections available.");
      }
      conn_free(data,conn);
      CVar9 = 0x59;
      conn = (connectdata *)0x0;
      asyncp = local_e8;
      protocol_done = local_f0;
      goto LAB_005c7c85;
    }
    CVar9 = Curl_ssl_conn_config_init(data,conn);
    asyncp = local_e8;
    protocol_done = local_f0;
    if (CVar9 != CURLUE_OK) goto LAB_005c7c85;
    Curl_attach_connection(data,conn);
    CVar9 = Curl_conncache_add_conn(data);
    asyncp = local_e8;
    protocol_done = local_f0;
    if (CVar9 != CURLUE_OK) goto LAB_005c7c85;
    if ((((data->state).authhost.picked & 0x28) != 0) &&
       (((data->state).authhost.field_0x18 & 1) != 0)) {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"NTLM picked AND auth done set, clear picked");
      }
      (data->state).authhost.picked = 0;
      puVar1 = &(data->state).authhost.field_0x18;
      *puVar1 = *puVar1 & 0xfe;
    }
    pcVar22 = conn;
    if ((((data->state).authproxy.picked & 0x28) != 0) &&
       (((data->state).authproxy.field_0x18 & 1) != 0)) {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
      }
      (data->state).authproxy.picked = 0;
      puVar1 = &(data->state).authproxy.field_0x18;
      *puVar1 = *puVar1 & 0xfe;
    }
  }
  Curl_init_do(data,pcVar22);
  CVar9 = setup_range(data);
  conn = pcVar22;
  asyncp = local_e8;
  protocol_done = local_f0;
  if (CVar9 == CURLUE_OK) {
    pcVar22->seek_func = (data->set).seek_func;
    pcVar22->seek_client = (data->set).seek_client;
    CVar9 = resolve_server(data,pcVar22,local_e8);
    asyncp = local_e8;
    protocol_done = local_f0;
    if (CVar9 == CURLUE_OK) {
      CVar9 = Curl_conn_ev_data_setup(data);
      asyncp = local_e8;
      protocol_done = local_f0;
    }
  }
LAB_005c7c85:
  if (CVar9 == CURLUE_OK) {
    if ((conn->easyq).size < 2) {
      CVar9 = CURLUE_OK;
      if (*asyncp == false) {
        CVar9 = Curl_setup_conn(data,protocol_done);
      }
    }
    else {
      *protocol_done = true;
      CVar9 = CURLUE_OK;
    }
  }
  if (((CVar9 != 0x59) && (conn != (connectdata *)0x0)) && (CVar9 != CURLUE_OK)) {
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data,conn,true);
    Curl_disconnect(data,conn,true);
  }
  return CVar9;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.size = data->req.maxdownload = -1;
  data->req.no_body = data->set.opt_no_body;

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data, conn, TRUE);
    Curl_disconnect(data, conn, TRUE);
  }

  return result;
}